

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,int n)

{
  ImGuiID id_00;
  uint *puVar1;
  undefined4 in_ESI;
  ImGuiID id;
  ImGuiID seed;
  undefined4 in_stack_fffffffffffffff0;
  
  puVar1 = ImVector<unsigned_int>::back
                     ((ImVector<unsigned_int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  id_00 = ImHashData(&stack0xfffffffffffffff4,4,*puVar1);
  ImGui::KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetID(int n)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
    ImGui::KeepAliveID(id);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO(id, ImGuiDataType_S32, (intptr_t)n);
#endif
    return id;
}